

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

size_t __thiscall docopt::Option::hash(Option *this)

{
  size_t *seed_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t seed;
  LeafPattern *in_stack_fffffffffffffff0;
  
  seed_00 = (size_t *)LeafPattern::hash(in_stack_fffffffffffffff0);
  hash_combine<std::__cxx11::string>(seed_00,in_RDI);
  hash_combine<std::__cxx11::string>(seed_00,in_RDI);
  hash_combine<int>(seed_00,(int *)in_RDI);
  return (size_t)seed_00;
}

Assistant:

virtual size_t hash() const override {
			size_t seed = LeafPattern::hash();
			hash_combine(seed, fShortOption);
			hash_combine(seed, fLongOption);
			hash_combine(seed, fArgcount);
			return seed;
		}